

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Bytes __thiscall Omega_h::bit_neg_each(Omega_h *this,Bytes *a)

{
  int *piVar1;
  Alloc *pAVar2;
  int iVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar4;
  long lVar5;
  LO size_in;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  Bytes BVar8;
  Write<signed_char> b;
  type f;
  Write<signed_char> local_68;
  string local_50;
  Write<signed_char> local_30;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    size_in = (LO)pAVar2->size;
  }
  else {
    size_in = (LO)((ulong)pAVar2 >> 3);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  Write<signed_char>::Write(&local_68,size_in,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_50._M_dataplus._M_p = (pointer)((local_68.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_50._M_string_length = (size_type)local_68.shared_alloc_.direct_ptr;
  pAVar2 = (a->write_).shared_alloc_.alloc;
  local_50.field_2._M_allocated_capacity = (size_type)pAVar2;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_50.field_2._M_allocated_capacity = (size_type)(Alloc *)(pAVar2->size * 8 + 1);
    }
    else {
      pAVar2->use_count = pAVar2->use_count + 1;
    }
  }
  local_50.field_2._8_8_ = (a->write_).shared_alloc_.direct_ptr;
  if (((ulong)pAVar2 & 1) == 0) {
    iVar3 = (int)pAVar2->size;
  }
  else {
    iVar3 = (int)((ulong)pAVar2 >> 3);
  }
  _Var6._M_p = local_50._M_dataplus._M_p;
  if (((ulong)local_50._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_50._M_dataplus._M_p != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      _Var6._M_p = (pointer)(*(long *)local_50._M_dataplus._M_p * 8 + 1);
    }
    else {
      *(int *)(local_50._M_dataplus._M_p + 0x30) = *(int *)(local_50._M_dataplus._M_p + 0x30) + 1;
    }
  }
  uVar7 = local_50.field_2._M_allocated_capacity;
  if ((local_50.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_50.field_2._M_allocated_capacity != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      uVar7 = (Alloc *)(*(long *)local_50.field_2._M_allocated_capacity * 8 + 1);
    }
    else {
      *(int *)(local_50.field_2._M_allocated_capacity + 0x30) =
           *(int *)(local_50.field_2._M_allocated_capacity + 0x30) + 1;
    }
  }
  if (0 < iVar3) {
    if (((ulong)_Var6._M_p & 7) == 0 && (Alloc *)_Var6._M_p != (Alloc *)0x0) {
      ((Alloc *)_Var6._M_p)->use_count = ((Alloc *)_Var6._M_p)->use_count + -1;
      _Var6._M_p = (pointer)(((Alloc *)_Var6._M_p)->size * 8 + 1);
    }
    if ((uVar7 & 7) == 0 && (Alloc *)uVar7 != (Alloc *)0x0) {
      ((Alloc *)uVar7)->use_count = ((Alloc *)uVar7)->use_count + -1;
      uVar7 = ((Alloc *)uVar7)->size * 8 + 1;
    }
    entering_parallel = '\0';
    lVar5 = 0;
    do {
      *(byte *)((long)local_68.shared_alloc_.direct_ptr + lVar5) =
           ~*(byte *)(local_50.field_2._8_8_ + lVar5);
      lVar5 = lVar5 + 1;
    } while (iVar3 != (int)lVar5);
  }
  if ((uVar7 & 7) == 0 && (Alloc *)uVar7 != (Alloc *)0x0) {
    piVar1 = &((Alloc *)uVar7)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)uVar7);
      operator_delete((void *)uVar7,0x48);
    }
  }
  if (((ulong)_Var6._M_p & 7) == 0 && (Alloc *)_Var6._M_p != (Alloc *)0x0) {
    piVar1 = &((Alloc *)_Var6._M_p)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)_Var6._M_p);
      operator_delete(_Var6._M_p,0x48);
    }
  }
  local_30.shared_alloc_.alloc = local_68.shared_alloc_.alloc;
  local_30.shared_alloc_.direct_ptr = local_68.shared_alloc_.direct_ptr;
  if ((((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
       local_68.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + -1;
    local_30.shared_alloc_.alloc = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_68.shared_alloc_.alloc = (Alloc *)0x0;
  local_68.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_30);
  pAVar2 = local_30.shared_alloc_.alloc;
  pvVar4 = extraout_RDX;
  if (((ulong)local_30.shared_alloc_.alloc & 7) == 0 && local_30.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_30.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_30.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_00;
    }
  }
  uVar7 = local_50.field_2._M_allocated_capacity;
  if ((local_50.field_2._M_allocated_capacity & 7) == 0 &&
      (Alloc *)local_50.field_2._M_allocated_capacity != (Alloc *)0x0) {
    piVar1 = (int *)(local_50.field_2._M_allocated_capacity + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_50.field_2._M_allocated_capacity);
      operator_delete((void *)uVar7,0x48);
      pvVar4 = extraout_RDX_01;
    }
  }
  _Var6._M_p = local_50._M_dataplus._M_p;
  if (((ulong)local_50._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_50._M_dataplus._M_p != (Alloc *)0x0) {
    piVar1 = (int *)(local_50._M_dataplus._M_p + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_50._M_dataplus._M_p);
      operator_delete(_Var6._M_p,0x48);
      pvVar4 = extraout_RDX_02;
    }
  }
  pAVar2 = local_68.shared_alloc_.alloc;
  if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 && local_68.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_68.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar4 = extraout_RDX_03;
    }
  }
  BVar8.write_.shared_alloc_.direct_ptr = pvVar4;
  BVar8.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar8.write_.shared_alloc_;
}

Assistant:

Bytes bit_neg_each(Bytes a) {
  Write<I8> b(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { b[i] = ~(a[i]); };
  parallel_for(a.size(), f, "bit_neg_each");
  return b;
}